

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O3

int main(int argc,char **argv)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  char *__s1;
  Sound_Channels SVar4;
  int iVar5;
  Sound_Channels _channels;
  Sound_Driver _driver;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  int stop;
  char *local_88;
  char *local_80;
  char *local_78;
  char *local_70;
  addrinfo local_68;
  
  local_80 = (char *)0x0;
  bVar7 = false;
  bVar6 = false;
  bVar8 = false;
  bVar1 = false;
  bVar2 = false;
  bVar3 = false;
  local_88 = (char *)0x0;
  SVar4 = SOUND_CHANNELS_STEREO;
  do {
    _channels = SVar4;
    iVar5 = getopt(argc,argv,"h:p:a:lHf:dc:D:");
    __s1 = _optarg;
    SVar4 = _channels;
    switch(iVar5) {
    case 0x61:
      iVar5 = strcmp(_optarg,"pulse");
      bVar6 = iVar5 == 0;
      iVar5 = strcmp(__s1,"alsa");
      bVar7 = iVar5 == 0;
      iVar5 = strcmp(__s1,"file");
      bVar8 = iVar5 == 0;
      bVar3 = true;
      break;
    case 0x62:
    case 0x65:
    case 0x67:
    case 0x69:
    case 0x6a:
    case 0x6b:
    case 0x6d:
    case 0x6e:
    case 0x6f:
switchD_0010284b_caseD_62:
      main_cold_9();
      return 0;
    case 99:
      iVar5 = strcmp(_optarg,"mono");
      SVar4 = SOUND_CHANNELS_MONO;
      if (iVar5 != 0) {
        iVar5 = strcmp(__s1,"left");
        SVar4 = SOUND_CHANNELS_LEFT;
        if ((iVar5 != 0) && (iVar5 = strcmp(__s1,"right"), SVar4 = _channels, iVar5 == 0)) {
          SVar4 = SOUND_CHANNELS_RIGHT;
        }
      }
      break;
    case 100:
      debug_nmea = 1;
      break;
    case 0x66:
      local_80 = _optarg;
      break;
    case 0x68:
      local_78 = _optarg;
      bVar1 = true;
      break;
    case 0x6c:
      show_levels = '\x01';
      break;
    case 0x70:
      local_70 = _optarg;
      bVar2 = true;
      break;
    default:
      if (iVar5 != 0x44) {
        if (iVar5 == -1) {
          if (argc < 2) {
            main_cold_8();
          }
          else if (bVar1) {
            if (bVar2) {
              if (bVar3) {
                if (((bVar7) || (bVar6)) || (bVar8)) {
                  local_68.ai_canonname = (char *)0x0;
                  local_68.ai_next = (addrinfo *)0x0;
                  local_68.ai_addrlen = 0;
                  local_68._20_4_ = 0;
                  local_68.ai_addr = (sockaddr *)0x0;
                  local_68.ai_socktype = 2;
                  local_68.ai_protocol = 0x11;
                  local_68.ai_flags = 0x20;
                  local_68.ai_family = 0;
                  iVar5 = getaddrinfo(local_78,local_70,&local_68,(addrinfo **)&addr);
                  if (iVar5 == 0) {
                    sock = socket(addr->ai_family,addr->ai_socktype,addr->ai_protocol);
                    if (sock != -1) {
                      if (show_levels == '\x01') {
                        on_sound_level_changed = sound_level_changed;
                      }
                      on_nmea_sentence_received = nmea_sentence_received;
                      _driver = DRIVER_PULSE;
                      if (!bVar6) {
                        _driver = (uint)!bVar7 * 2;
                      }
                      iVar5 = initSoundDecoder(_channels,_driver,local_80,local_88);
                      local_68._0_8_ = (ulong)(uint)local_68.ai_family << 0x20;
                      if (iVar5 == 0) {
                        main_cold_3();
                      }
                      else {
                        runSoundDecoder(&local_68.ai_flags);
                      }
                      freeSoundDecoder();
                      freeaddrinfo((addrinfo *)addr);
                      return 0;
                    }
                    main_cold_4();
                  }
                  else {
                    main_cold_2();
                  }
                }
                else {
                  main_cold_1();
                }
              }
              else {
                main_cold_5();
              }
            }
            else {
              main_cold_6();
            }
          }
          else {
            main_cold_7();
          }
          return 1;
        }
        goto switchD_0010284b_caseD_62;
      }
      local_88 = _optarg;
      iVar5 = strcmp(_optarg,"list");
      if (iVar5 == 0) {
        printInDevices();
        return 0;
      }
    }
  } while( true );
}

Assistant:

int main(int argc, char *argv[]) {
    Sound_Channels channels = SOUND_CHANNELS_STEREO;
    char *host, *port, *file_name=NULL;
    const char *params=CMD_PARAMS;
    int alsa=0, pulse=0, file=0, winmm=0;
    int hfnd=0, pfnd=0, afnd=0;
#ifdef WIN32
    unsigned int deviceId=WAVE_MAPPER;
#endif
#ifdef HAVE_ALSA
    char *alsaDevice=NULL;
#endif
    int opt;
    while ((opt = getopt(argc, argv, params)) != -1) {
        switch (opt) {
        case 'h':
            host = optarg;
            hfnd = 1;
            break;
        case 'p':
            port = optarg;
            pfnd = 1;
            break;
        case 'a':
        #ifdef HAVE_PULSEAUDIO
            pulse = strcmp(optarg, "pulse") == 0;
        #endif
        #ifdef HAVE_ALSA
            alsa = strcmp(optarg, "alsa") == 0;
        #endif
        #ifdef WIN32
            winmm = strcmp(optarg, "winmm") == 0;
        #endif
            file = strcmp(optarg, "file") == 0;
            afnd = 1;
            break;
        case 'c':
            if (!strcmp(optarg, "mono")) channels = SOUND_CHANNELS_MONO;
            else if (!strcmp(optarg, "left")) channels = SOUND_CHANNELS_LEFT;
            else if (!strcmp(optarg, "right")) channels = SOUND_CHANNELS_RIGHT;
            break;
        case 'l':
            show_levels = 1;
            break;
        case 'f':
            file_name = optarg;
            break;
        case 'd':
            debug_nmea = 1;
            break;
#ifdef WIN32
        case 'D':
            if (!strcmp(optarg, "list")) {
                printInDevices();
                return EXIT_SUCCESS;
            } else {
                deviceId = atoi(optarg);
            }
            break;
#endif
#ifdef HAVE_ALSA
        case 'D':
            if (!strcmp(optarg, "list")) {
                printInDevices();
                return EXIT_SUCCESS;
            } else {
                alsaDevice = optarg;
            }
            break;
#endif
        case 'H':
        default:
            fprintf(stderr, HELP_MSG);
            return EXIT_SUCCESS;
            break;
        }
    }

    if (argc < 2) {
        fprintf(stderr, HELP_MSG);
        return EXIT_FAILURE;
    }

    if (!hfnd) {
        fprintf(stderr, "Host is not set\n");
        return EXIT_FAILURE;
    }

    if (!pfnd) {
        fprintf(stderr, "Port is not set\n");
        return EXIT_FAILURE;
    }

    if (!afnd) {
        fprintf(stderr, "Audio driver is not set\n");
        return EXIT_FAILURE;
    }

    if (!alsa && !pulse && !winmm && !file) {
        fprintf(stderr, "Invalid audio driver\n");
        return EXIT_FAILURE;
    }

    if (!initSocket(host, port)) {
        return EXIT_FAILURE;
    }
    if (show_levels) on_sound_level_changed=sound_level_changed;
    on_nmea_sentence_received=nmea_sentence_received;
    Sound_Driver driver = DRIVER_FILE;
#ifdef HAVE_ALSA
    if (alsa) driver = DRIVER_ALSA;
#endif
#ifdef HAVE_PULSEAUDIO
    if (pulse) driver = DRIVER_PULSE;
#endif
    int OK=0;
#ifdef WIN32
    if (!file) driver = DRIVER_WINMM;
    OK=initSoundDecoder(channels, driver, file_name, deviceId);
#else
#ifdef HAVE_ALSA
    OK=initSoundDecoder(channels, driver, file_name, alsaDevice);
#else
    OK=initSoundDecoder(channels, driver, file_name);
#endif
#endif
    int stop=0;
    if (OK) {
        runSoundDecoder(&stop);
    } else {
        fprintf(stderr, "%s\n", errorSoundDecoder);
    }
    freeSoundDecoder();
    freeaddrinfo(addr);
#ifdef WIN32
    WSACleanup();
#endif
    return 0;
}